

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O0

method class_get_method_type_safe(vector v,type_id ret,type_id *args,size_t size)

{
  method_conflict m_00;
  int iVar1;
  ulong uVar2;
  undefined8 *puVar3;
  type_id *in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  method m;
  size_t method_size;
  size_t iterator;
  ulong size_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (in_RDI != 0) {
    uVar2 = vector_size(in_RDI);
    for (size_00 = 0; size_00 < uVar2; size_00 = size_00 + 1) {
      puVar3 = (undefined8 *)vector_at(in_RDI,size_00);
      m_00 = (method_conflict)*puVar3;
      method_signature(m_00);
      iVar1 = signature_compare((signature)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                (type_id)((ulong)in_RDX >> 0x20),in_RCX,size_00);
      if (iVar1 == 0) {
        vector_destroy(in_RDI);
        return m_00;
      }
    }
    vector_destroy(in_RDI);
  }
  return (method)0x0;
}

Assistant:

method class_get_method_type_safe(vector v, type_id ret, type_id args[], size_t size)
{
	if (v != NULL)
	{
		size_t iterator, method_size = vector_size(v);

		for (iterator = 0; iterator < method_size; ++iterator)
		{
			method m = vector_at_type(v, iterator, method);

			if (signature_compare(method_signature(m), ret, args, size) == 0)
			{
				vector_destroy(v);
				return m;
			}
		}

		vector_destroy(v);
	}

	return NULL;
}